

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileStdio::Open
          (FileStdio *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  element_type *peVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result<_IO_FILE_*> *p_Var6;
  int *piVar7;
  FILE *pFVar8;
  long *plVar9;
  size_type *psVar10;
  char *__modes;
  pointer pcVar11;
  _State_baseV2 *__tmp_1;
  bool bVar12;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  undefined1 local_d8 [32];
  string local_b8;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    piVar7 = __errno_location();
    *piVar7 = 0;
    pFVar8 = fopen((name->_M_dataplus)._M_p,"rwb");
    this->m_File = (FILE *)pFVar8;
    fseek(pFVar8,0,2);
    goto LAB_006422c5;
  }
  if (openMode == Read) {
    piVar7 = __errno_location();
    *piVar7 = 0;
    pcVar11 = (name->_M_dataplus)._M_p;
    __modes = "rb";
  }
  else {
    if (openMode != Write) {
      local_d8._0_8_ = (element_type *)(local_d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Toolkit","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"transport::file::FileStdio","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Open","");
      std::operator+(&local_50,"unknown open mode for file ",__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                ((string *)local_d8,&local_b8,&local_90,&local_50,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      goto LAB_006422c5;
    }
    if (async) {
      this->m_IsOpening = true;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885330;
      peVar1 = (element_type *)(p_Var5 + 1);
      p_Var5[2]._M_use_count = 0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00885380;
      p_Var6 = (_Result<_IO_FILE_*> *)operator_new(0x20);
      std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var6);
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(_Atomic_word **)&p_Var5[4]._M_use_count = &p_Var5[5]._M_use_count;
      pcVar11 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var5[4]._M_use_count,pcVar11,pcVar11 + name->_M_string_length);
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_90._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_90._M_dataplus._M_p = &PTR___State_008853d8;
      *(element_type **)((long)local_90._M_dataplus._M_p + 8) = peVar1;
      *(code **)((long)local_90._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>
           ::_M_run;
      *(size_type *)((long)local_90._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(&local_b8,&local_90,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_90._M_dataplus._M_p + 8))();
      }
      uVar2 = local_d8._8_8_;
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)local_b8._M_dataplus._M_p;
      bVar12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8._0_8_ = peVar1;
      local_d8._8_8_ = p_Var5;
      if (bVar12) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885418;
        p_Var5[2]._M_use_count = 0;
        p_Var5[1]._M_use_count = 0;
        p_Var5[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00885468;
        p_Var6 = (_Result<_IO_FILE_*> *)operator_new(0x20);
        std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var6);
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)p_Var6;
        *(_Atomic_word **)&p_Var5[3]._M_use_count = &p_Var5[4]._M_use_count;
        pcVar11 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var5[3]._M_use_count,pcVar11,pcVar11 + name->_M_string_length);
        uVar2 = local_d8._8_8_;
        bVar12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_d8._0_8_ = (element_type *)(p_Var5 + 1);
        local_d8._8_8_ = p_Var5;
        if (bVar12) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
      }
      std::__basic_future<_IO_FILE_*>::__basic_future
                ((__basic_future<_IO_FILE_*> *)&local_b8,(__state_type *)local_d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      sVar4 = local_b8._M_string_length;
      _Var3._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      p_Var5 = (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_p;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      goto LAB_006422c5;
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    pcVar11 = (name->_M_dataplus)._M_p;
    __modes = "wb";
  }
  pFVar8 = fopen(pcVar11,__modes);
  this->m_File = (FILE *)pFVar8;
LAB_006422c5:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "couldn\'t open file ",__rhs);
    plVar9 = (long *)std::__cxx11::string::append((char *)local_d8);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_70.field_2._M_allocated_capacity = *psVar10;
      local_70.field_2._8_8_ = plVar9[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar10;
      local_70._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_70._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    CheckFile(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileStdio::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }
}